

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O1

int SharpYuvConvertWithOptions
              (void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,int rgb_bit_depth,
              void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,int v_stride,
              int yuv_bit_depth,int width,int height,SharpYuvOptions *options)

{
  fixed_y_t *dst;
  long lVar1;
  SharpYuvTransferFunctionType transfer_type;
  SharpYuvConversionMatrix *pSVar2;
  int iVar3;
  bool bVar4;
  fixed_t *pfVar5;
  int16_t *piVar6;
  long lVar7;
  fixed_y_t *pfVar8;
  byte bVar9;
  uint16_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int iVar14;
  ulong uVar15;
  fixed_y_t *dst_00;
  uint16_t *__ptr;
  uint16_t *__ptr_00;
  uint16_t *__ptr_01;
  int16_t *__ptr_02;
  fixed_t *__ptr_03;
  fixed_t *dst_01;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  byte bVar20;
  ushort uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ushort uVar25;
  ushort uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  uint uVar33;
  ulong uVar34;
  short sVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  int16_t *piVar39;
  uint16_t *puVar40;
  int16_t *piVar41;
  uint uVar42;
  long lVar43;
  short sVar44;
  undefined2 uVar45;
  uint uVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  int iVar50;
  uint64_t total_size;
  size_t sVar51;
  uint16_t *puVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int bit_depth;
  fixed_y_t *src2;
  fixed_t *best_uv_base;
  int uv_h;
  int len;
  SharpYuvConversionMatrix scaled_matrix;
  long local_250;
  int16_t *local_230;
  fixed_t *local_1a0;
  int16_t *local_188;
  void *local_150;
  void *local_148;
  void *local_140;
  undefined8 local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 local_e8;
  int iStack_e0;
  int iStack_dc;
  undefined8 local_d8;
  int iStack_d0;
  int iStack_cc;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8;
  fixed_t *local_a0;
  int16_t *local_98;
  uint16_t *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  fixed_y_t *local_68;
  long local_60;
  ulong local_58;
  fixed_y_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar32;
  
  iVar50 = 1 << ((byte)rgb_bit_depth - 1 & 0x1f);
  uVar31 = 2;
  if (0xc < rgb_bit_depth) {
    uVar31 = (ulong)(0xe - rgb_bit_depth);
  }
  local_150 = y_ptr;
  local_140 = u_ptr;
  local_148 = v_ptr;
  auVar54._0_4_ = -(uint)(r_ptr == (void *)0x0);
  auVar54._4_4_ = -(uint)(g_ptr == (void *)0x0);
  auVar54._8_4_ = -(uint)(b_ptr == (void *)0x0);
  auVar54._12_4_ = -(uint)(y_ptr == (void *)0x0);
  iVar37 = movmskps((int)r_ptr,auVar54);
  iVar30 = 0;
  iVar14 = 0;
  if (((((((v_ptr != (void *)0x0 && 0x80000001 < width + 0x80000001U) && u_ptr != (void *)0x0) &&
         0x80000001 < height + 0x80000001U) && iVar37 == 0) &&
       (iVar14 = iVar30, (uint)rgb_bit_depth < 0x11)) &&
      ((0x11500U >> (rgb_bit_depth & 0x1fU) & 1) != 0)) &&
     (((uint)yuv_bit_depth < 0xd && ((0x1500U >> (yuv_bit_depth & 0x1fU) & 1) != 0)))) {
    pSVar2 = options->yuv_matrix;
    transfer_type = options->transfer_type;
    if (((rgb_bit_depth < 9) || (((rgb_stride | rgb_step) & 1U) == 0)) &&
       ((yuv_bit_depth < 9 || (((u_stride | y_stride | v_stride) & 1U) == 0)))) {
      uVar42 = ~(-1 << ((byte)yuv_bit_depth & 0x1f));
      SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);
      if (rgb_bit_depth == yuv_bit_depth) {
        local_f8 = *(undefined8 *)pSVar2->rgb_to_y;
        iStack_f0 = (int)*(undefined8 *)(pSVar2->rgb_to_y + 2);
        local_e8 = *(undefined8 *)pSVar2->rgb_to_u;
        iStack_e0 = (int)*(undefined8 *)(pSVar2->rgb_to_u + 2);
        local_d8 = *(undefined8 *)pSVar2->rgb_to_v;
        iStack_d0 = (int)*(undefined8 *)(pSVar2->rgb_to_v + 2);
      }
      else {
        uVar29 = ~(-1 << ((byte)rgb_bit_depth & 0x1f));
        lVar23 = 0;
        do {
          *(int *)((long)&local_f8 + lVar23 * 4) =
               (int)(pSVar2->rgb_to_y[lVar23] * uVar42 + iVar50) / (int)uVar29;
          *(int *)((long)&local_e8 + lVar23 * 4) =
               (int)(pSVar2->rgb_to_u[lVar23] * uVar42 + iVar50) / (int)uVar29;
          *(int *)((long)&local_d8 + lVar23 * 4) =
               (int)(pSVar2->rgb_to_v[lVar23] * uVar42 + iVar50) / (int)uVar29;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
      }
      iVar14 = (int)uVar31;
      bVar20 = (byte)uVar31;
      bVar9 = -bVar20;
      iVar50 = pSVar2->rgb_to_y[3] >> (bVar9 & 0x1f);
      if (-1 < iVar14) {
        iVar50 = pSVar2->rgb_to_y[3] << (bVar20 & 0x1f);
      }
      _iStack_f0 = CONCAT44(iVar50,iStack_f0);
      iVar50 = pSVar2->rgb_to_u[3] >> (bVar9 & 0x1f);
      if (-1 < iVar14) {
        iVar50 = pSVar2->rgb_to_u[3] << (bVar20 & 0x1f);
      }
      _iStack_e0 = CONCAT44(iVar50,iStack_e0);
      iVar50 = pSVar2->rgb_to_v[3] >> (bVar9 & 0x1f);
      if (-1 < iVar14) {
        iVar50 = pSVar2->rgb_to_v[3] << (bVar20 & 0x1f);
      }
      _iStack_d0 = CONCAT44(iVar50,iStack_d0);
      uVar29 = width + 1U & 0x7ffffffe;
      uVar32 = (ulong)uVar29;
      uVar46 = height + 1U & 0x7ffffffe;
      uVar48 = width + 1U >> 1;
      uVar24 = (ulong)uVar48;
      uVar15 = (ulong)(uVar29 * 3);
      local_c8 = uVar31;
      dst_00 = (fixed_y_t *)malloc(uVar15 * 4);
      sVar51 = uVar32 * uVar46 * 2;
      __ptr = (uint16_t *)malloc(sVar51);
      __ptr_00 = (uint16_t *)malloc(sVar51);
      __ptr_01 = (uint16_t *)malloc(uVar32 * 4);
      uVar31 = (ulong)(uVar48 * 3);
      sVar51 = uVar46 * uVar31;
      __ptr_02 = (int16_t *)malloc(sVar51);
      __ptr_03 = (fixed_t *)malloc(sVar51);
      local_b0 = uVar31 * 2;
      dst_01 = (fixed_t *)malloc(local_b0);
      auVar55._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
      auVar55._4_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
      auVar55._8_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
      auVar55._12_4_ = -(uint)((int)__ptr_03 == 0 && (int)((ulong)__ptr_03 >> 0x20) == 0);
      iVar50 = movmskps((int)dst_01,auVar55);
      iVar30 = 0;
      iVar14 = 0;
      if ((((iVar50 == 0) && (iVar14 = iVar30, __ptr_01 != (uint16_t *)0x0)) &&
          (dst_01 != (fixed_t *)0x0)) && (dst_00 != (fixed_y_t *)0x0)) {
        iVar50 = (int)local_c8 + rgb_bit_depth;
        dVar53 = (double)uVar46 * (double)uVar29 * 3.0;
        local_c0 = (ulong)dVar53;
        uVar16 = (long)local_c0 >> 0x3f;
        dst = dst_00 + uVar15;
        local_a8 = uVar31;
        if (0 < height) {
          uVar31 = (ulong)(uVar29 * 2);
          uVar36 = 1;
          if (1 < uVar29) {
            uVar36 = uVar29;
          }
          iVar14 = rgb_stride * 2;
          uVar18 = (ulong)(uVar36 * 2);
          uVar34 = (ulong)(uVar48 & 0x3fffffff);
          lVar43 = (long)__ptr + uVar31;
          lVar23 = uVar15 * 2 + uVar34 * 8;
          lVar1 = uVar31 + uVar15 * 2;
          lVar28 = (long)__ptr_00 + uVar31;
          iVar30 = 0;
          puVar52 = __ptr;
          puVar40 = __ptr_00;
          local_1a0 = __ptr_03;
          local_188 = __ptr_02;
          do {
            ImportOneRow((uint8_t *)r_ptr,(uint8_t *)g_ptr,(uint8_t *)b_ptr,rgb_step,rgb_bit_depth,
                         width,dst_00);
            if (iVar30 == height + -1) {
              memcpy(dst,dst_00,uVar15 * 2);
            }
            else {
              ImportOneRow((uint8_t *)((long)r_ptr + (long)rgb_stride),
                           (uint8_t *)((long)g_ptr + (long)rgb_stride),
                           (uint8_t *)((long)b_ptr + (long)rgb_stride),rgb_step,rgb_bit_depth,width,
                           dst);
            }
            uVar17 = 0;
            do {
              *(short *)((long)puVar52 + uVar17) =
                   (short)((uint)*(ushort *)((long)dst_00 + uVar17 + uVar34 * 8) * 0x127c +
                           (uint)*(ushort *)((long)dst_00 + uVar17 + uVar31) * 0xb717 +
                           (uint)*(ushort *)((long)dst_00 + uVar17) * 0x366d + 0x8000 >> 0x10);
              uVar17 = uVar17 + 2;
            } while (uVar18 != uVar17);
            uVar17 = 0;
            do {
              *(short *)(lVar43 + uVar17) =
                   (short)((uint)*(ushort *)((long)dst_00 + uVar17 + lVar23) * 0x127c +
                           (uint)*(ushort *)((long)dst_00 + uVar17 + lVar1) * 0xb717 +
                           (uint)*(ushort *)((long)dst + uVar17) * 0x366d + 0x8000 >> 0x10);
              uVar17 = uVar17 + 2;
            } while (uVar18 != uVar17);
            uVar17 = 0;
            do {
              uVar11 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar17),iVar50,transfer_type);
              uVar12 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar17 + uVar31),iVar50,transfer_type
                                 );
              uVar13 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar17 + uVar34 * 8),iVar50,
                                  transfer_type);
              uVar10 = SharpYuvLinearToGamma
                                 ((uint32_t)
                                  ((ulong)uVar13 * 0x127c +
                                   (ulong)uVar12 * 0xb717 + (ulong)uVar11 * 0x366d + 0x8000 >> 0x10)
                                  ,iVar50,transfer_type);
              *(uint16_t *)((long)puVar40 + uVar17) = uVar10;
              uVar17 = uVar17 + 2;
            } while (uVar18 != uVar17);
            uVar17 = 0;
            do {
              uVar11 = SharpYuvGammaToLinear(*(uint16_t *)((long)dst + uVar17),iVar50,transfer_type)
              ;
              uVar12 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar17 + lVar1),iVar50,transfer_type)
              ;
              uVar13 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar17 + lVar23),iVar50,transfer_type
                                 );
              uVar10 = SharpYuvLinearToGamma
                                 ((uint32_t)
                                  ((ulong)uVar13 * 0x127c +
                                   (ulong)uVar12 * 0xb717 + (ulong)uVar11 * 0x366d + 0x8000 >> 0x10)
                                  ,iVar50,transfer_type);
              *(uint16_t *)(lVar28 + uVar17) = uVar10;
              uVar17 = uVar17 + 2;
            } while (uVar18 != uVar17);
            UpdateChroma(dst_00,dst,local_1a0,uVar48,rgb_bit_depth,transfer_type);
            memcpy(local_188,local_1a0,local_b0);
            local_188 = local_188 + local_a8;
            local_1a0 = local_1a0 + local_a8;
            r_ptr = (void *)((long)r_ptr + (long)iVar14);
            g_ptr = (void *)((long)g_ptr + (long)iVar14);
            b_ptr = (void *)((long)b_ptr + (long)iVar14);
            iVar30 = iVar30 + 2;
            puVar52 = puVar52 + uVar34 * 4;
            lVar43 = lVar43 + uVar34 * 8;
            puVar40 = puVar40 + uVar34 * 4;
            lVar28 = lVar28 + uVar34 * 8;
          } while (iVar30 < height);
        }
        uVar36 = height + 1U >> 1;
        local_c0 = local_c0 | (long)(dVar53 - 9.223372036854776e+18) & uVar16;
        uVar38 = -1 << ((byte)iVar50 & 0x1f);
        uVar25 = ~(ushort)uVar38;
        iVar14 = (int)(uVar29 - 1) >> 1;
        local_38 = (long)(int)(uVar29 * 2 + -1);
        uVar31 = (ulong)(uVar29 * 2);
        uVar33 = 1;
        if (1 < uVar29) {
          uVar33 = uVar29;
        }
        local_40 = (long)__ptr_01 + uVar31;
        local_60 = uVar31 + uVar15 * 2 + -2;
        local_50 = dst_00 + (ulong)(uVar48 & 0x3fffffff) * 4;
        local_68 = dst_00 + (ulong)(uVar48 & 0x3fffffff) * 4 + uVar15;
        local_48 = uVar31 + uVar15 * 2 + (long)dst_00;
        local_70 = (ulong)(uVar48 * 2) - 2;
        local_78 = uVar31 - 2;
        local_80 = (long)dst_00 + uVar31;
        local_b8 = 0xffffffffffffffff;
        iVar30 = 0;
        uVar16 = local_a8;
        local_88 = uVar24;
        do {
          uVar27 = 0;
          uVar34 = 0;
          puVar52 = __ptr;
          piVar41 = __ptr_02;
          local_230 = __ptr_02;
          local_a0 = __ptr_03;
          local_98 = __ptr_02;
          local_90 = __ptr_00;
          do {
            piVar39 = piVar41;
            lVar23 = local_70;
            uVar18 = 0;
            if ((int)uVar27 < (int)(uVar46 - 2)) {
              uVar18 = uVar16 & 0xffffffff;
            }
            piVar41 = piVar39 + uVar18;
            lVar1 = uVar18 * 2 + local_70;
            iVar37 = -3;
            lVar47 = 0;
            lVar49 = 0;
            lVar28 = local_60;
            sVar51 = uVar15 * 2;
            lVar43 = local_78;
            local_58 = uVar34;
            do {
              iVar3 = *(short *)((long)piVar39 + lVar49) * 3;
              uVar22 = (*(short *)((long)local_230 + lVar49) + iVar3 + 2 >> 2) + (uint)*puVar52;
              uVar26 = uVar25;
              if ((int)uVar22 < 0) {
                uVar26 = 0;
              }
              if ((uVar22 & uVar38) == 0) {
                uVar26 = (ushort)uVar22;
              }
              uVar22 = (iVar3 + *(short *)((long)piVar41 + lVar49) + 2 >> 2) + (uint)puVar52[uVar32]
              ;
              uVar21 = uVar25;
              if ((int)uVar22 < 0) {
                uVar21 = 0;
              }
              if ((uVar22 & uVar38) == 0) {
                uVar21 = (ushort)uVar22;
              }
              *(ushort *)((long)dst_00 + lVar47) = uVar26;
              *(ushort *)((long)dst_00 + sVar51) = uVar21;
              (*SharpYuvFilterRow)
                        ((int16_t *)((long)piVar39 + lVar49),(int16_t *)((long)local_230 + lVar49),
                         iVar14,puVar52 + 1,(uint16_t *)((long)dst_00 + lVar47 + 2),iVar50);
              (*SharpYuvFilterRow)
                        ((int16_t *)((long)piVar39 + lVar49),(int16_t *)((long)piVar41 + lVar49),
                         iVar14,puVar52 + uVar32 + 1,(uint16_t *)((long)dst_00 + sVar51 + 2),iVar50)
              ;
              lVar7 = local_80;
              iVar3 = *(short *)((long)piVar39 + lVar49 + lVar23) * 3;
              uVar22 = (*(short *)((long)local_230 + lVar49 + lVar23) + iVar3 + 2 >> 2) +
                       (uint)puVar52[(int)(uVar29 - 1)];
              uVar26 = uVar25;
              if ((int)uVar22 < 0) {
                uVar26 = 0;
              }
              if ((uVar22 & uVar38) == 0) {
                uVar26 = (ushort)uVar22;
              }
              uVar22 = (iVar3 + *(short *)((long)piVar39 + lVar49 + lVar1) + 2 >> 2) +
                       (uint)puVar52[local_38];
              uVar21 = uVar25;
              if ((int)uVar22 < 0) {
                uVar21 = 0;
              }
              if ((uVar22 & uVar38) == 0) {
                uVar21 = (ushort)uVar22;
              }
              *(ushort *)((long)dst_00 + lVar43) = uVar26;
              *(ushort *)((long)dst_00 + lVar28) = uVar21;
              lVar49 = lVar49 + (ulong)(uVar48 * 2);
              lVar43 = lVar43 + uVar31;
              lVar47 = lVar47 + uVar31;
              lVar28 = lVar28 + uVar31;
              sVar51 = sVar51 + uVar31;
              iVar37 = iVar37 + 1;
            } while (iVar37 != 0);
            uVar16 = 0;
            do {
              uVar11 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)dst_00 + uVar16),iVar50,transfer_type);
              uVar12 = SharpYuvGammaToLinear(*(uint16_t *)(lVar7 + uVar16),iVar50,transfer_type);
              uVar13 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)local_50 + uVar16),iVar50,transfer_type);
              uVar10 = SharpYuvLinearToGamma
                                 ((uint32_t)
                                  ((ulong)uVar13 * 0x127c +
                                   (ulong)uVar12 * 0xb717 + (ulong)uVar11 * 0x366d + 0x8000 >> 0x10)
                                  ,iVar50,transfer_type);
              pfVar8 = local_68;
              *(uint16_t *)((long)__ptr_01 + uVar16) = uVar10;
              uVar16 = uVar16 + 2;
            } while (uVar33 * 2 != uVar16);
            uVar16 = 0;
            do {
              uVar11 = SharpYuvGammaToLinear(*(uint16_t *)((long)dst + uVar16),iVar50,transfer_type)
              ;
              uVar12 = SharpYuvGammaToLinear(*(uint16_t *)(local_48 + uVar16),iVar50,transfer_type);
              uVar13 = SharpYuvGammaToLinear
                                 (*(uint16_t *)((long)pfVar8 + uVar16),iVar50,transfer_type);
              uVar10 = SharpYuvLinearToGamma
                                 ((uint32_t)
                                  ((ulong)uVar13 * 0x127c +
                                   (ulong)uVar12 * 0xb717 + (ulong)uVar11 * 0x366d + 0x8000 >> 0x10)
                                  ,iVar50,transfer_type);
              *(uint16_t *)(local_40 + uVar16) = uVar10;
              uVar16 = uVar16 + 2;
            } while (uVar33 * 2 != uVar16);
            UpdateChroma(dst_00,dst,dst_01,uVar48,rgb_bit_depth,transfer_type);
            puVar40 = local_90;
            uVar19 = (*SharpYuvUpdateY)(local_90,__ptr_01,puVar52,uVar29 * 2,iVar50);
            piVar6 = local_98;
            pfVar5 = local_a0;
            uVar16 = local_a8;
            uVar34 = local_58 + uVar19;
            (*SharpYuvUpdateRGB)(local_a0,dst_01,local_98,(int)local_a8);
            puVar52 = puVar52 + uVar31;
            local_98 = piVar6 + uVar16;
            local_90 = puVar40 + uVar31;
            local_a0 = pfVar5 + uVar16;
            uVar27 = uVar27 + 2;
            local_230 = piVar39;
          } while (uVar27 < uVar46);
          if ((iVar30 == 0) || (bVar4 = true, uVar34 <= local_b8 && local_c0 <= uVar34)) {
            bVar4 = false;
            local_b8 = uVar34;
          }
        } while ((!bVar4) && (iVar30 = iVar30 + 1, iVar30 != 4));
        bVar9 = (char)local_c8 + 0x10;
        iVar50 = 1 << ((char)local_c8 + 0xfU & 0x1f);
        if (width < 2) {
          width = 1;
        }
        uVar46 = 1;
        if (1 < height) {
          uVar46 = height;
        }
        uVar33 = 0;
        piVar41 = __ptr_02;
        puVar52 = __ptr;
        do {
          uVar31 = 0;
          do {
            uVar38 = (uint)(uVar31 >> 1) & 0x7fffffff;
            uVar25 = puVar52[uVar31];
            uVar38 = (int)(((int)*(short *)((long)piVar41 + (ulong)((uint)uVar31 & 0xfffffffe)) +
                           (uint)uVar25) * (int)local_f8 + iVar50 +
                           ((int)piVar41[uVar48 + uVar38] + (uint)uVar25) * local_f8._4_4_ +
                          ((int)piVar41[uVar38 + uVar29] + (uint)uVar25) * iStack_f0 + iStack_ec) >>
                     (bVar9 & 0x1f);
            sVar35 = (short)uVar38;
            if (yuv_bit_depth < 9) {
              uVar27 = (uint)(byte)-(-1 < sVar35);
              if ((uVar38 & 0xffff) < 0x100) {
                uVar27 = uVar38;
              }
              *(char *)((long)local_150 + uVar31) = (char)uVar27;
            }
            else {
              if ((int)uVar42 < (int)sVar35) {
                uVar38 = uVar42;
              }
              uVar45 = (undefined2)uVar38;
              if (sVar35 < 0) {
                uVar45 = 0;
              }
              *(undefined2 *)((long)local_150 + uVar31 * 2) = uVar45;
            }
            uVar31 = uVar31 + 1;
          } while ((uint)width != uVar31);
          piVar41 = piVar41 + (uVar33 & 1) * uVar48 * 3;
          local_150 = (void *)((long)local_150 + (long)y_stride);
          uVar33 = uVar33 + 1;
          puVar52 = (uint16_t *)((long)puVar52 + (ulong)(uVar48 * 4));
        } while (uVar33 != uVar46);
        if (uVar48 < 2) {
          uVar24 = 1;
        }
        uVar29 = 1;
        if (1 < uVar36) {
          uVar29 = uVar36;
        }
        local_250 = (ulong)(uVar48 * 4) + (long)__ptr_02;
        piVar41 = __ptr_02 + local_88;
        uVar46 = 0;
        piVar39 = __ptr_02;
        do {
          uVar31 = 0;
          do {
            iVar14 = (int)*(short *)(local_250 + uVar31 * 2);
            uVar48 = (int)local_e8 * piVar39[uVar31] + iVar50 +
                     iStack_e0 * iVar14 + local_e8._4_4_ * piVar41[uVar31] + iStack_dc >>
                     (bVar9 & 0x1f);
            uVar36 = piVar39[uVar31] * (int)local_d8 + iVar50 +
                     iVar14 * iStack_d0 + piVar41[uVar31] * local_d8._4_4_ + iStack_cc >>
                     (bVar9 & 0x1f);
            sVar44 = (short)uVar48;
            sVar35 = (short)uVar36;
            if (yuv_bit_depth < 9) {
              uVar33 = (uint)(byte)-(-1 < sVar44);
              if ((uVar48 & 0xffff) < 0x100) {
                uVar33 = uVar48;
              }
              *(char *)((long)local_140 + uVar31) = (char)uVar33;
              uVar48 = (uint)(byte)-(-1 < sVar35);
              if ((uVar36 & 0xffff) < 0x100) {
                uVar48 = uVar36;
              }
              *(char *)((long)local_148 + uVar31) = (char)uVar48;
            }
            else {
              if ((int)uVar42 < (int)sVar44) {
                uVar48 = uVar42;
              }
              uVar45 = (undefined2)uVar48;
              if (sVar44 < 0) {
                uVar45 = 0;
              }
              *(undefined2 *)((long)local_140 + uVar31 * 2) = uVar45;
              if ((int)uVar42 < (int)sVar35) {
                uVar36 = uVar42;
              }
              uVar45 = (undefined2)uVar36;
              if (sVar35 < 0) {
                uVar45 = 0;
              }
              *(undefined2 *)((long)local_148 + uVar31 * 2) = uVar45;
            }
            uVar31 = uVar31 + 1;
          } while (uVar24 != uVar31);
          local_140 = (void *)((long)local_140 + (long)u_stride);
          local_148 = (void *)((long)local_148 + (long)v_stride);
          uVar46 = uVar46 + 1;
          local_250 = local_250 + local_b0;
          piVar41 = (int16_t *)((long)piVar41 + local_b0);
          piVar39 = (int16_t *)((long)piVar39 + local_b0);
        } while (uVar46 != uVar29);
        iVar14 = 1;
      }
      free(__ptr);
      free(__ptr_02);
      free(__ptr_00);
      free(__ptr_03);
      free(__ptr_01);
      free(dst_01);
      free(dst_00);
    }
  }
  return iVar14;
}

Assistant:

int SharpYuvConvertWithOptions(const void* r_ptr, const void* g_ptr,
                               const void* b_ptr, int rgb_step, int rgb_stride,
                               int rgb_bit_depth, void* y_ptr, int y_stride,
                               void* u_ptr, int u_stride, void* v_ptr,
                               int v_stride, int yuv_bit_depth, int width,
                               int height, const SharpYuvOptions* options) {
  const SharpYuvConversionMatrix* yuv_matrix = options->yuv_matrix;
  SharpYuvTransferFunctionType transfer_type = options->transfer_type;
  SharpYuvConversionMatrix scaled_matrix;
  const int rgb_max = (1 << rgb_bit_depth) - 1;
  const int rgb_round = 1 << (rgb_bit_depth - 1);
  const int yuv_max = (1 << yuv_bit_depth) - 1;
  const int sfix = GetPrecisionShift(rgb_bit_depth);

  if (width < 1 || height < 1 || width == INT_MAX || height == INT_MAX ||
      r_ptr == NULL || g_ptr == NULL || b_ptr == NULL || y_ptr == NULL ||
      u_ptr == NULL || v_ptr == NULL) {
    return 0;
  }
  if (rgb_bit_depth != 8 && rgb_bit_depth != 10 && rgb_bit_depth != 12 &&
      rgb_bit_depth != 16) {
    return 0;
  }
  if (yuv_bit_depth != 8 && yuv_bit_depth != 10 && yuv_bit_depth != 12) {
    return 0;
  }
  if (rgb_bit_depth > 8 && (rgb_step % 2 != 0 || rgb_stride % 2 != 0)) {
    // Step/stride should be even for uint16_t buffers.
    return 0;
  }
  if (yuv_bit_depth > 8 &&
      (y_stride % 2 != 0 || u_stride % 2 != 0 || v_stride % 2 != 0)) {
    // Stride should be even for uint16_t buffers.
    return 0;
  }
  // The address of the function pointer is used to avoid a read race.
  SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);

  // Add scaling factor to go from rgb_bit_depth to yuv_bit_depth, to the
  // rgb->yuv conversion matrix.
  if (rgb_bit_depth == yuv_bit_depth) {
    memcpy(&scaled_matrix, yuv_matrix, sizeof(scaled_matrix));
  } else {
    int i;
    for (i = 0; i < 3; ++i) {
      scaled_matrix.rgb_to_y[i] =
          (yuv_matrix->rgb_to_y[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_u[i] =
          (yuv_matrix->rgb_to_u[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_v[i] =
          (yuv_matrix->rgb_to_v[i] * yuv_max + rgb_round) / rgb_max;
    }
  }
  // Also incorporate precision change scaling.
  scaled_matrix.rgb_to_y[3] = Shift(yuv_matrix->rgb_to_y[3], sfix);
  scaled_matrix.rgb_to_u[3] = Shift(yuv_matrix->rgb_to_u[3], sfix);
  scaled_matrix.rgb_to_v[3] = Shift(yuv_matrix->rgb_to_v[3], sfix);

  return DoSharpArgbToYuv(
      (const uint8_t*)r_ptr, (const uint8_t*)g_ptr, (const uint8_t*)b_ptr,
      rgb_step, rgb_stride, rgb_bit_depth, (uint8_t*)y_ptr, y_stride,
      (uint8_t*)u_ptr, u_stride, (uint8_t*)v_ptr, v_stride, yuv_bit_depth,
      width, height, &scaled_matrix, transfer_type);
}